

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O2

void __thiscall Node::SmoothTypes(Node *this,Node *DefaultType)

{
  Node **ppNVar1;
  VARTYPE VVar2;
  int iVar3;
  Node *pNVar4;
  Node *this_00;
  string *this_01;
  allocator local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  while (ppNVar1 = this->Tree, ppNVar1[1] != (Node *)0x0) {
    this = this->Block[0];
    DefaultType = ppNVar1[1];
    if (this == (Node *)0x0) {
      return;
    }
  }
  pNVar4 = this->Tree[0];
  if (DefaultType == (Node *)0x0) {
    this_00 = (Node *)operator_new(0x70);
    if (pNVar4 == (Node *)0x0) {
      iVar3 = UnguessVarType(VARTYPE_NONE);
      std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
      Node(this_00,iVar3,&local_c8,0,0);
      this->Tree[1] = this_00;
      this_01 = &local_c8;
    }
    else {
      std::__cxx11::string::string((string *)&local_88,(string *)&pNVar4->TextValue);
      VVar2 = GuessVarType(&local_88);
      iVar3 = UnguessVarType(VVar2);
      std::__cxx11::string::string((string *)&local_a8,"",&local_c9);
      Node(this_00,iVar3,&local_a8,0,0);
      this->Tree[1] = this_00;
      std::__cxx11::string::~string((string *)&local_a8);
      this_01 = &local_88;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_48,(string *)&pNVar4->TextValue);
    VVar2 = GuessVarType(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pNVar4 = (Node *)operator_new(0x70);
    if (VVar2 == VARTYPE_REAL) {
      Node(pNVar4,DefaultType);
      this->Tree[1] = pNVar4;
      goto LAB_00109138;
    }
    iVar3 = UnguessVarType(VVar2);
    std::__cxx11::string::string((string *)&local_68,"",&local_c9);
    Node(pNVar4,iVar3,&local_68,0,0);
    this->Tree[1] = pNVar4;
    this_01 = &local_68;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_00109138:
  if (this->Block[0] == (Node *)0x0) {
    return;
  }
  SmoothTypes(this->Block[0],DefaultType);
  return;
}

Assistant:

void Node::SmoothTypes(
	Node* DefaultType	/**< Node that defines the default types */
)
{
	bool actualtype = false;

	if (Tree[1] == 0)
	{
		//
		// Fake up a defintion for this segment since we dont have
		// on entered directly on this line.
		//
		if (DefaultType != 0)
		{
			VARTYPE rawtype = GuessVarType(Tree[0]->TextValue);
			if (rawtype == VARTYPE_REAL)
			{
				Tree[1] = new Node(*DefaultType);
			}
			else
			{
				Tree[1] = new Node(UnguessVarType(rawtype));
			}
		}
		else
		{
			if (Tree[0] != 0)
			{
				Tree[1] = new Node(UnguessVarType(
					GuessVarType(Tree[0]->TextValue)));
			}
			else
			{
				Tree[1] = new Node(UnguessVarType(VARTYPE_NONE));
			}
		}
	}
	else
	{
		//
		// We need to keep track of weither we have been given
		// an actual definition on this segment, or if we have
		// faked one up.
		//
		actualtype = true;
	}

	if (Block[0] != 0)
	{
		//
		// If we have an actual type here, use it, else use
		// what came from a previous segment
		//
		if (actualtype)
		{
			Block[0]->SmoothTypes(Tree[1]);
		}
		else
		{
			Block[0]->SmoothTypes(DefaultType);
		}
	}
}